

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O0

string * __thiscall TCLAP::ArgException::argId_abi_cxx11_(ArgException *this)

{
  bool bVar1;
  allocator<char> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_ffffffffffffffb8;
  allocator<char> local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  
  __s = in_RDI;
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffb8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,(char *)__s,in_RSI);
    std::allocator<char>::~allocator(&local_11);
  }
  else {
    std::operator+(in_stack_00000008,unaff_retaddr);
  }
  return in_RDI;
}

Assistant:

std::string argId() const  
		{ 
			if ( _argId == "undefined" )
				return " ";
			else
				return ( "Argument: " + _argId ); 
		}